

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos,ImGuiDockNode *dock_node)

{
  ImGuiWindow *window;
  ImVec2 pos_00;
  ImVec2 p_min;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImU32 col;
  ImU32 col_00;
  ImGuiCol idx;
  float fVar4;
  float fVar5;
  bool hovered;
  bool held;
  ImRect bb;
  bool local_4a;
  bool local_49;
  ImRect local_48;
  ImVec2 local_38;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  fVar4 = (GImGui->Style).FramePadding.x;
  fVar5 = (GImGui->Style).FramePadding.y;
  local_48.Max.x = fVar4 + fVar4 + pos->x + GImGui->FontSize;
  local_48.Max.y = fVar5 + fVar5 + GImGui->FontSize + pos->y;
  local_48.Min = *pos;
  ItemAdd(&local_48,id,(ImRect *)0x0,0);
  bVar2 = ButtonBehavior(&local_48,id,&local_4a,&local_49,0);
  if ((local_49 != true) || (idx = 0x17, local_4a == false)) {
    idx = local_4a + 0x15;
  }
  col = GetColorU32(idx,1.0);
  col_00 = GetColorU32(0,1.0);
  if ((local_4a != false) || (local_49 == true)) {
    local_38.y = (local_48.Min.y + local_48.Max.y) * 0.5 + -0.5;
    local_38.x = (local_48.Min.x + local_48.Max.x) * 0.5 + 0.0;
    ImDrawList::AddCircleFilled(window->DrawList,&local_38,pIVar1->FontSize * 0.5 + 1.0,col,0xc);
  }
  fVar4 = local_48.Min.x + (pIVar1->Style).FramePadding.x;
  fVar5 = local_48.Min.y + (pIVar1->Style).FramePadding.y;
  if (dock_node == (ImGuiDockNode *)0x0) {
    pos_00.y = fVar5;
    pos_00.x = fVar4;
    RenderArrow(window->DrawList,pos_00,col_00,(window->Collapsed ^ 1) * 2 + 1,1.0);
  }
  else {
    p_min.y = fVar5;
    p_min.x = fVar4;
    RenderArrowDockMenu(window->DrawList,p_min,pIVar1->FontSize,col_00);
  }
  bVar3 = IsItemActive();
  if (bVar3) {
    bVar3 = IsMouseDragging(0,-1.0);
    if (bVar3) {
      StartMouseMovingWindowOrNode(window,dock_node,true);
    }
  }
  return bVar2;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    //bool is_dock_menu = (window->DockNodeAsHost && !window->Collapsed);
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter() + ImVec2(0,-0.5f), g.FontSize * 0.5f + 1.0f, bg_col, 12);

    if (dock_node)
        RenderArrowDockMenu(window->DrawList, bb.Min + g.Style.FramePadding, g.FontSize, text_col);
    else
        RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindowOrNode(window, dock_node, true);

    return pressed;
}